

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarCommand.cpp
# Opt level: O3

void __thiscall VarCommand::doCommand(VarCommand *this)

{
  pointer pcVar1;
  unsigned_long uVar2;
  undefined8 uVar3;
  ulong index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined1 local_40 [8];
  string name;
  
  uVar2 = DataCommands::getIndex(this->dataCommands);
  index = uVar2 + 1;
  DataCommands::getSeparated_abi_cxx11_(&local_58,this->dataCommands);
  if (index < (ulong)((long)local_58.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    pcVar1 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[index]._M_dataplus._M_p;
    local_40 = (undefined1  [8])&name._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,
               pcVar1 + local_58.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[index]._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    DataVars::addNewVar(this->dataVars,(string *)local_40);
    DataCommands::setIndex(this->dataCommands,index);
    if (local_40 != (undefined1  [8])&name._M_string_length) {
      operator_delete((void *)local_40,name._M_string_length + 1);
    }
    return;
  }
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     index);
  if (local_40 != (undefined1  [8])&local_58) {
    operator_delete((void *)local_40,name._M_string_length + 1);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void VarCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;
    // get the name from the vector in dataCommands
    string name = this->dataCommands->getSeparated().at(index);
    // else, we add the new var to the map in dataVars
    this->dataVars->addNewVar(name);
    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}